

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> __thiscall
unodb::detail::impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (impl_helpers *this,
          inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,node_ptr *node_in_parent)

{
  impl_helpers iVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> __n;
  undefined4 extraout_var;
  basic_node_ptr<unodb::detail::node_header> bVar5;
  uint uVar6;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> _Var7;
  undefined7 in_register_00000011;
  undefined8 uVar8;
  db_type *db_instance_00;
  byte child_to_delete;
  bool bVar9;
  undefined1 auVar10 [16];
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar11;
  undefined1 local_58 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  current_node;
  
  db_instance_00 = k.field_0._8_8_;
  __n = k.field_0._0_8_;
  auVar10[0] = SUB81(inode,0);
  auVar10[1] = auVar10[0];
  auVar10[2] = auVar10[0];
  auVar10[3] = auVar10[0];
  auVar10[4] = auVar10[0];
  auVar10[5] = auVar10[0];
  auVar10[6] = auVar10[0];
  auVar10[7] = auVar10[0];
  auVar10[8] = auVar10[0];
  auVar10[9] = auVar10[0];
  auVar10[10] = auVar10[0];
  auVar10[0xb] = auVar10[0];
  auVar10[0xc] = auVar10[0];
  auVar10[0xd] = auVar10[0];
  auVar10[0xe] = auVar10[0];
  auVar10[0xf] = auVar10[0];
  auVar10 = vpcmpeqb_avx(auVar10,ZEXT416(*(uint *)(this + 0xc)));
  iVar1 = this[8];
  uVar6 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) & ~(-1 << ((byte)iVar1 & 0x1f));
  uVar8 = 0;
  if (uVar6 != 0) {
    uVar3 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    puVar2 = *(uint **)(this + (ulong)uVar3 * 8 + 0x10);
    uVar8 = 1;
    if (((ulong)puVar2 & 7) == 0) {
      _Var7._4_4_ = 0;
      _Var7._0_4_ = *puVar2;
      bVar9 = _Var7._M_value == __n._M_value;
      if (_Var7._M_value < __n._M_value) {
        __n = _Var7;
      }
      current_node._M_t.
      super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
      ._M_head_impl =
           (inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *)db_instance;
      iVar4 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),puVar2 + 2,(size_t)__n);
      __n._1_7_ = (undefined7)(CONCAT44(extraout_var,iVar4) >> 8);
      __n._0_1_ = iVar4 == 0 && bVar9;
      if (iVar4 == 0 && bVar9) {
        child_to_delete = -(uVar6 == 0) | (byte)uVar3;
        if (iVar1 == (impl_helpers)0x2) {
          local_58 = (undefined1  [8])db_instance_00;
          current_node._M_t.
          super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          .
          super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          .
          super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          ._M_head_impl.db =
               (_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                )(_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                  )this;
          bVar5 = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::leave_last_child((basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                                      *)this,child_to_delete,db_instance_00);
          *(uintptr_t *)
           &(current_node._M_t.
             super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             .
             super__Head_base<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
            ._M_head_impl)->
            super_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_> =
               bVar5.tagged_ptr;
          std::
          unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_58);
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::account_shrinking_inode<(unodb::node_type)1>(db_instance_00);
        }
        else {
          basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::remove((basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    *)this,(char *)(ulong)child_to_delete);
        }
        __n._M_value = (basic_node_ptr<unodb::detail::node_header> *)0x0;
      }
      else {
        uVar8 = 0;
      }
    }
    else {
      __n._M_value = (basic_node_ptr<unodb::detail::node_header> *)(this + (ulong)uVar3 * 8 + 0x10);
    }
  }
  oVar11.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._8_8_ =
       uVar8;
  oVar11.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload._M_value = __n._M_value;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar11.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

std::optional<detail::node_ptr*> impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    db<Key, Value>& db_instance, detail::node_ptr* node_in_parent) {
  const auto [child_i, child_ptr]{inode.find_child(key_byte)};

  if (child_ptr == nullptr) return {};

  const auto child_ptr_val{child_ptr->load()};
  if (child_ptr_val.type() != node_type::LEAF)
    return unwrap_fake_critical_section(child_ptr);

  const auto* const leaf{
      child_ptr_val.template ptr<typename db<Key, Value>::leaf_type*>()};
  if (!leaf->matches(k)) return {};

  if (UNODB_DETAIL_UNLIKELY(inode.is_min_size())) {
    if constexpr (std::is_same_v<INode, inode_4<Key, Value>>) {
      auto current_node{art_policy<Key, Value>::make_db_inode_unique_ptr(
          &inode, db_instance)};
      *node_in_parent = current_node->leave_last_child(child_i, db_instance);
    } else {
      auto new_node{
          INode::smaller_derived_type::create(db_instance, inode, child_i)};
      *node_in_parent =
          node_ptr{new_node.release(), INode::smaller_derived_type::type};
    }
#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS
    return nullptr;
  }

  inode.remove(child_i, db_instance);
  return nullptr;
}